

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testDefaultOptionalValueOnUnsupportedSpec(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *pAVar5;
  NeuralNetwork *this;
  NeuralNetworkLayer *this_00;
  Tensor *this_01;
  string *psVar6;
  long lVar7;
  ostream *poVar8;
  undefined1 local_c8 [8];
  Result res;
  StackLayerParams *params;
  NeuralNetworkLayer *layers;
  NeuralNetwork *nn;
  ArrayFeatureType *outShape;
  FeatureDescription *out;
  ArrayFeatureType *arr;
  FeatureType *type;
  FeatureDescription *in2;
  ArrayFeatureType *inShape1;
  FeatureDescription *in1;
  Model m;
  
  CoreML::Specification::Model::Model((Model *)&in1);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&in1);
  pFVar3 = CoreML::Specification::ModelDescription::add_input(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"input1");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::set_datatype
            (pAVar5,ArrayFeatureType_ArrayDataType_FLOAT32);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,3);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,2);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&in1);
  pFVar3 = CoreML::Specification::ModelDescription::add_input(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"input2");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  CoreML::Specification::FeatureType::set_isoptional(pFVar4,true);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::set_datatype(pAVar5,ArrayFeatureType_ArrayDataType_INT32)
  ;
  CoreML::Specification::ArrayFeatureType::set_intdefaultvalue(pAVar5,2);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,3);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,2);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&in1);
  pFVar3 = CoreML::Specification::ModelDescription::add_output(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"output");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::set_datatype
            (pAVar5,ArrayFeatureType_ArrayDataType_FLOAT32);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,3);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,1);
  this = CoreML::Specification::Model::mutable_neuralnetwork((Model *)&in1);
  CoreML::Specification::NeuralNetwork::set_arrayinputshapemapping(this,EXACT_ARRAY_MAPPING);
  this_00 = CoreML::Specification::NeuralNetwork::add_layers(this);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input1");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"output");
  this_01 = CoreML::Specification::NeuralNetworkLayer::add_inputtensor(this_00);
  CoreML::Specification::Tensor::set_rank(this_01,3);
  res.m_message.field_2._8_8_ = CoreML::Specification::NeuralNetworkLayer::mutable_stack(this_00);
  CoreML::Specification::StackLayerParams::set_axis
            ((StackLayerParams *)res.m_message.field_2._8_8_,2);
  CoreML::Specification::Model::set_specificationversion((Model *)&in1,4);
  CoreML::Model::validate((Result *)local_c8,(Model *)&in1);
  bVar1 = CoreML::Result::good((Result *)local_c8);
  if (bVar1) {
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar8 = std::operator<<(poVar8,":");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x157);
    poVar8 = std::operator<<(poVar8,": error: ");
    poVar8 = std::operator<<(poVar8,"!((res).good())");
    poVar8 = std::operator<<(poVar8," was false, expected true.");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    m._oneof_case_[0] = 1;
  }
  else {
    psVar6 = CoreML::Result::message_abi_cxx11_((Result *)local_c8);
    lVar7 = std::__cxx11::string::find((char *)psVar6,0x4c1383);
    if (lVar7 == -1) {
      poVar8 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                              );
      poVar8 = std::operator<<(poVar8,":");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x158);
      poVar8 = std::operator<<(poVar8,": error: ");
      poVar8 = std::operator<<(poVar8,
                               "res.message().find(\"Default value for optional inputs is supported from specification 5 (iOS 14)\") != std::string::npos"
                              );
      poVar8 = std::operator<<(poVar8," was false, expected true.");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      m._oneof_case_[0] = 1;
    }
    else {
      m._oneof_case_[0] = 0;
    }
  }
  CoreML::Result::~Result((Result *)local_c8);
  CoreML::Specification::Model::~Model((Model *)&in1);
  return m._oneof_case_[0];
}

Assistant:

int testDefaultOptionalValueOnUnsupportedSpec() {

    Specification::Model m;

    auto *in1 = m.mutable_description()->add_input();
    in1->set_name("input1");
    auto *inShape1 = in1->mutable_type()->mutable_multiarraytype();
    inShape1->set_datatype(Specification::ArrayFeatureType::ArrayDataType::ArrayFeatureType_ArrayDataType_FLOAT32);

    inShape1->add_shape(3);
    inShape1->add_shape(5);
    inShape1->add_shape(2);

    auto *in2 = m.mutable_description()->add_input();
    in2->set_name("input2");
    auto type = in2->mutable_type();
    type->set_isoptional(true);
    auto arr = type->mutable_multiarraytype();
    arr->set_datatype(Specification::ArrayFeatureType::ArrayDataType::ArrayFeatureType_ArrayDataType_INT32);
    arr->set_intdefaultvalue(2);
    arr->add_shape(3);
    arr->add_shape(5);
    arr->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->set_datatype(Specification::ArrayFeatureType::ArrayDataType::ArrayFeatureType_ArrayDataType_FLOAT32);
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(1);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input1");
    layers->add_output("output");
    layers->add_inputtensor()->set_rank(3);

    auto *params = layers->mutable_stack();
    params->set_axis(2);

    m.set_specificationversion(4);
    // axis should be in range [-(rank + 1), rank + 1)
    Result res = Model::validate(m);
    ML_ASSERT_BAD(res);
    ML_ASSERT(res.message().find("Default value for optional inputs is supported from specification 5 (iOS 14)") != std::string::npos);

    return 0;
}